

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,cmComputeLinkInformation *pcli,
          cmLinkLineComputer *linkLineComputer,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries,string *frameworkPath,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkPath)

{
  cmMakefile *pcVar1;
  cmValue cVar2;
  string *psVar3;
  string libPathTerminator;
  string fwSearchFlag;
  string stdLibString;
  string libPathFlag;
  string linkLanguage;
  cmAlphaNum local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_f8;
  string *local_f0;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_e8;
  cmAlphaNum local_e0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  char *local_50;
  size_t local_48;
  
  psVar3 = &pcli->LinkLanguage;
  local_f8 = linkLibraries;
  local_f0 = frameworkPath;
  local_e8 = linkPath;
  std::__cxx11::string::string((string *)&local_50,(string *)psVar3);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&local_138,(string *)psVar3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
                 "CMAKE_",&local_138);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
                 "_LIBRARY_PATH_FLAG");
  cVar2 = cmMakefile::GetDefinition(pcVar1,(string *)&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_138);
  if (cVar2.Value == (string *)0x0) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"CMAKE_LIBRARY_PATH_FLAG",(allocator<char> *)&local_e0);
    cmMakefile::GetRequiredDefinition(pcVar1,(string *)&local_168);
    std::__cxx11::string::_M_assign((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_168);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_70);
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&local_90,(string *)psVar3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
                 "CMAKE_",&local_90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
                 "_LIBRARY_PATH_TERMINATOR");
  cVar2 = cmMakefile::GetDefinition(pcVar1,(string *)&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_90);
  if (cVar2.Value == (string *)0x0) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"CMAKE_LIBRARY_PATH_TERMINATOR",(allocator<char> *)&local_e0);
    cmMakefile::GetRequiredDefinition(pcVar1,(string *)&local_168);
    std::__cxx11::string::_M_assign((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_168);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_138);
  }
  pcVar1 = this->Makefile;
  local_168.View_._M_len = (size_t)&DAT_00000006;
  local_168.View_._M_str = "CMAKE_";
  std::__cxx11::string::string((string *)&local_118,(string *)psVar3);
  local_e0.View_._M_len = local_118._M_string_length;
  local_e0.View_._M_str = local_118._M_dataplus._M_p;
  cmStrCat<char[20]>(&local_b0,&local_168,&local_e0,(char (*) [20])"_STANDARD_LIBRARIES");
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_b0);
  std::__cxx11::string::string((string *)&local_90,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_118);
  pcVar1 = this->Makefile;
  local_168.View_._M_len = (size_t)&DAT_00000006;
  local_168.View_._M_str = "CMAKE_";
  local_e0.View_._M_len = local_48;
  local_e0.View_._M_str = local_50;
  cmStrCat<char[23]>(&local_118,&local_168,&local_e0,(char (*) [23])0x618fba);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_118);
  std::__cxx11::string::string((string *)&local_b0,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_118);
  cmLinkLineComputer::ComputeFrameworkPath((string *)&local_168,linkLineComputer,pcli,&local_b0);
  std::__cxx11::string::operator=((string *)local_f0,(string *)&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  cmLinkLineComputer::ComputeLinkPath(linkLineComputer,pcli,&local_70,&local_138,local_e8);
  (*linkLineComputer->_vptr_cmLinkLineComputer[3])(linkLineComputer,pcli,&local_90,local_f8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(
  cmComputeLinkInformation* pcli, cmLinkLineComputer* linkLineComputer,
  std::vector<BT<std::string>>& linkLibraries, std::string& frameworkPath,
  std::vector<BT<std::string>>& linkPath)
{
  cmComputeLinkInformation& cli = *pcli;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag;
  if (cmValue value = this->Makefile->GetDefinition(
        "CMAKE_" + cli.GetLinkLanguage() + "_LIBRARY_PATH_FLAG")) {
    libPathFlag = *value;
  } else {
    libPathFlag =
      this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  }

  std::string libPathTerminator;
  if (cmValue value = this->Makefile->GetDefinition(
        "CMAKE_" + cli.GetLinkLanguage() + "_LIBRARY_PATH_TERMINATOR")) {
    libPathTerminator = *value;
  } else {
    libPathTerminator =
      this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");
  }

  // Add standard libraries for this language.
  std::string stdLibString = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", cli.GetLinkLanguage(), "_STANDARD_LIBRARIES"));

  // Append the framework search path flags.
  std::string fwSearchFlag = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", linkLanguage, "_FRAMEWORK_SEARCH_FLAG"));

  frameworkPath = linkLineComputer->ComputeFrameworkPath(cli, fwSearchFlag);
  linkLineComputer->ComputeLinkPath(cli, libPathFlag, libPathTerminator,
                                    linkPath);
  linkLineComputer->ComputeLinkLibraries(cli, stdLibString, linkLibraries);
}